

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O0

void CoreML::writeFeatureDescription(stringstream *ss,FeatureDescription *feature)

{
  bool bVar1;
  ostream *poVar2;
  string *psVar3;
  FeatureType *wrapped;
  FeatureType local_48;
  string local_38;
  FeatureDescription *local_18;
  FeatureDescription *feature_local;
  stringstream *ss_local;
  
  local_18 = feature;
  feature_local = (FeatureDescription *)ss;
  poVar2 = std::operator<<((ostream *)(ss + 0x10),"\t\t");
  psVar3 = Specification::FeatureDescription::name_abi_cxx11_(local_18);
  poVar2 = std::operator<<(poVar2,(string *)psVar3);
  poVar2 = std::operator<<(poVar2," (");
  wrapped = Specification::FeatureDescription::type(local_18);
  FeatureType::FeatureType(&local_48,wrapped);
  FeatureType::toString_abi_cxx11_(&local_38,&local_48);
  poVar2 = std::operator<<(poVar2,(string *)&local_38);
  std::operator<<(poVar2,")");
  std::__cxx11::string::~string((string *)&local_38);
  FeatureType::~FeatureType(&local_48);
  psVar3 = Specification::FeatureDescription::shortdescription_abi_cxx11_(local_18);
  bVar1 = std::operator!=(psVar3,"");
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&feature_local->name_,": ");
    psVar3 = Specification::FeatureDescription::shortdescription_abi_cxx11_(local_18);
    std::operator<<(poVar2,(string *)psVar3);
  }
  std::operator<<((ostream *)&feature_local->name_,"\n");
  return;
}

Assistant:

static void writeFeatureDescription(std::stringstream& ss,
                                        const Specification::FeatureDescription& feature) {
        ss  << "\t\t"
            << feature.name()
            << " ("
            << FeatureType(feature.type()).toString()
            << ")";
        if (feature.shortdescription() != "") {
            ss << ": " << feature.shortdescription();
        }
        ss << "\n";
    }